

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

shared_ptr<Access> __thiscall Parser::offset(Parser *this,shared_ptr<Id> *a)

{
  _Sp_alloc_shared_tag<std::allocator<Constant>_> __a;
  element_type *peVar1;
  long lVar2;
  shared_ptr<Id> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<Access> sVar4;
  shared_ptr<Type> type;
  shared_ptr<Expr> t1;
  shared_ptr<Expr> w;
  shared_ptr<Expr> i;
  shared_ptr<Expr> loc;
  shared_ptr<Expr> t2;
  undefined1 local_d8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<Expr> local_98;
  shared_ptr<Expr> local_88;
  shared_ptr<Expr> local_78;
  shared_ptr<Expr> local_68;
  element_type *local_50;
  Arith *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<Id> *local_38;
  
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (Arith *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (in_RDX->super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8._48_8_ =
       (peVar1->super_Expr).type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0._M_pi =
       (peVar1->super_Expr).type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
    }
  }
  local_50 = (element_type *)this;
  local_38 = in_RDX;
  match((Parser *)a,0x5b);
  boolean((Parser *)local_d8);
  _Var3._M_pi = local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_d8._0_8_ = (Arith *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  match((Parser *)a,0x5d);
  if ((element_type *)local_d8._48_8_ == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(local_d8._48_8_,&Type::typeinfo,&Array::typeinfo,0);
  }
  _Var3._M_pi = local_a0._M_pi;
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
    }
  }
  local_d8._48_8_ = *(long *)(lVar2 + 0x38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_a0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x40));
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  local_d8._0_8_ = (Arith *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Constant,std::allocator<Constant>,int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Constant **)local_d8,
             (allocator<Constant> *)(local_d8 + 0x20),(int *)(local_d8._48_8_ + 0x30));
  std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Constant,Constant>
            ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_d8,
             (Constant *)local_d8._0_8_);
  _Var3._M_pi = local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_d8._0_8_ = (Arith *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_d8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._40_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aa78;
  local_d8._32_8_ = local_d8._40_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR_toString_abi_cxx11__0012ab28;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->_M_use_count = 0x2a;
  local_d8._0_8_ = (Arith *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Arith,std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Arith **)local_d8,
             (allocator<Arith> *)(local_d8 + 0x1f),(shared_ptr<Token> *)(local_d8 + 0x20),&local_78,
             &local_88);
  std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::_M_enable_shared_from_this_with<Arith,Arith>
            ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_d8,(Arith *)local_d8._0_8_);
  _Var3._M_pi = local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_d8._0_8_ = (Arith *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_);
  }
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count ==
      0x5b) {
    __a._M_a = (allocator<Constant> *)(local_d8 + 0x20);
    do {
      match((Parser *)a,0x5b);
      boolean((Parser *)local_d8);
      _Var3._M_pi = local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_d8._0_8_ = (Arith *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      match((Parser *)a,0x5d);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._48_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(local_d8._48_8_,&Type::typeinfo,&Array::typeinfo,0);
      }
      _Var3._M_pi = local_a0._M_pi;
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
        }
      }
      local_d8._48_8_ = *(long *)(lVar2 + 0x38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x40));
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      local_d8._0_8_ = (Arith *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Constant,std::allocator<Constant>,int&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Constant **)local_d8,
                 __a,(int *)(local_d8._48_8_ + 0x30));
      std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<Constant,Constant>
                ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_d8,
                 (Constant *)local_d8._0_8_);
      _Var3._M_pi = local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_d8._0_8_ = (Arith *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      local_d8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8._40_8_ = operator_new(0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aa78;
      local_d8._32_8_ = local_d8._40_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0012ab28;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->_M_use_count =
           0x2a;
      local_d8._0_8_ = (Arith *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Arith,std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Arith **)local_d8,
                 (allocator<Arith> *)(local_d8 + 0x1f),(shared_ptr<Token> *)__a._M_a,&local_78,
                 &local_88);
      std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<Arith,Arith>
                ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_d8,(Arith *)local_d8._0_8_)
      ;
      _Var3._M_pi = local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_d8._0_8_ = (Arith *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_);
      }
      local_d8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8._40_8_ = operator_new(0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aa78;
      local_d8._32_8_ = local_d8._40_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0012ab28;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._40_8_ + 0x10))->_M_use_count =
           0x2b;
      local_d8._0_8_ = (Arith *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Arith,std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Arith **)local_d8,
                 (allocator<Arith> *)(local_d8 + 0x1f),(shared_ptr<Token> *)__a._M_a,&local_68,
                 &local_98);
      std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<Arith,Arith>
                ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_d8,(Arith *)local_d8._0_8_)
      ;
      _Var3._M_pi = _Stack_40._M_pi;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_48 = (Arith *)local_d8._0_8_;
      local_d8._0_8_ = (Arith *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_);
      }
      local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_48;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &_Stack_40);
    } while ((a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count == 0x5b);
  }
  (local_50->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Access,std::allocator<Access>,std::shared_ptr<Id>&,std::shared_ptr<Expr>&,std::shared_ptr<Type>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(local_50->super_Op).super_Expr.super_Node.lexline,(Access **)local_50,
             (allocator<Access> *)local_d8,local_38,&local_68,(shared_ptr<Type> *)(local_d8 + 0x30))
  ;
  std::__shared_ptr<Access,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Access,Access>
            ((__shared_ptr<Access,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (Access *)(local_50->super_Op).super_Expr.super_Node._vptr_Node);
  _Var3._M_pi = extraout_RDX;
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_03;
  }
  if (local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_04;
  }
  if (local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_05;
  }
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
  return (shared_ptr<Access>)sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Access> offset(std::shared_ptr<Id> a) {
		std::shared_ptr<Expr> i, w, t1, t2, loc;
		std::shared_ptr<Type> type = a->type;
		match('['); i = boolean(); match(']');
		type = (std::dynamic_pointer_cast<Array>(type))->of;
		w = std::make_shared<Constant>(type->width);
		t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
		loc = t1;
		while (look->tag == '[') {
			match('['); i = boolean(); match(']');
			type = (std::dynamic_pointer_cast<Array>(type))->of;
			w = std::make_shared<Constant>(type->width);
			t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
			t2 = std::make_shared<Arith>(std::make_shared<Token>('+'), loc, t1);
			loc = t2;
		}
		return std::make_shared<Access>(a, loc, type);
	}